

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

size_t intersect_accel<true,false,false>(Ray *ray,Accel *accel,TraversalStats *stats)

{
  pointer pNVar1;
  Vec<float,_3UL> *pVVar2;
  float fVar3;
  Index IVar4;
  pointer pNVar5;
  pointer pPVar6;
  size_t sVar7;
  bool bVar8;
  float fVar9;
  undefined1 auVar10 [16];
  Index IVar11;
  Index IVar12;
  size_t i;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float t1;
  uint local_208;
  float local_204;
  undefined1 local_200 [12];
  undefined1 auStack_1f4 [4];
  Vec<float,_3UL> v;
  undefined1 local_1d8 [8];
  Vec<float,_3UL> *local_1d0;
  float *local_1c8;
  Vec<float,_3UL> *local_1c0;
  pointer local_1b8;
  Accel *local_1b0;
  Vec<float,_3UL> local_1a8;
  size_t local_198;
  Vec<float,_3UL> *local_190;
  size_t local_188;
  Index<32UL,_4UL> local_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> stack;
  
  auVar26._8_4_ = 0x3f800000;
  auVar26._0_8_ = 0x3f8000003f800000;
  auVar26._12_4_ = 0x3f800000;
  local_190 = &ray->dir;
  stack.size = 0;
  uVar13 = *(ulong *)(ray->dir).values;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar13;
  local_17c.value =
       (((accel->bvh).nodes.
         super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->index).value;
  _local_148 = vdivps_avx(auVar26,auVar19);
  fVar34 = 1.0 / (ray->dir).values[2];
  local_158 = ZEXT416((uint)fVar34);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)((ray->dir).values + 1);
  auVar16 = vpsrlvd_avx2(auVar20,_DAT_001170f0);
  auVar15._8_4_ = 2;
  auVar15._0_8_ = 0x400000002;
  auVar15._12_4_ = 4;
  auVar15 = vpandq_avx512vl(auVar16,auVar15);
  auVar16._8_4_ = 0x7fffffff;
  auVar16._0_8_ = 0x7fffffff7fffffff;
  auVar16._12_4_ = 0x7fffffff;
  auVar16 = vandps_avx512vl(_local_148,auVar16);
  auVar17._8_4_ = 0x7f800000;
  auVar17._0_8_ = 0x7f8000007f800000;
  auVar17._12_4_ = 0x7f800000;
  uVar14 = vpcmpd_avx512vl(auVar16,auVar17,1);
  uVar14 = uVar14 & 0xf;
  auVar10._8_4_ = 2;
  auVar10._0_8_ = 0x200000002;
  auVar10._12_4_ = 2;
  auVar16 = vpaddd_avx512vl(_local_148,auVar10);
  auVar17 = vblendmps_avx512vl(_local_148,auVar16);
  bVar8 = (bool)((byte)uVar14 & 1);
  local_168 = (float)((uint)bVar8 * auVar17._0_4_ | (uint)!bVar8 * auVar16._0_4_);
  bVar8 = (bool)((byte)(uVar14 >> 1) & 1);
  fStack_164 = (float)((uint)bVar8 * auVar17._4_4_ | (uint)!bVar8 * auVar16._4_4_);
  bVar8 = (bool)((byte)(uVar14 >> 2) & 1);
  fStack_160 = (float)((uint)bVar8 * auVar17._8_4_ | (uint)!bVar8 * auVar16._8_4_);
  bVar8 = SUB81(uVar14 >> 3,0);
  fStack_15c = (float)((uint)bVar8 * auVar17._12_4_ | (uint)!bVar8 * auVar16._12_4_);
  local_178 = ZEXT416((uint)((uint)ABS(fVar34) < 0x7f800000) * ((int)fVar34 + 2) +
                      (uint)((uint)ABS(fVar34) >= 0x7f800000) * (int)fVar34);
  local_208 = auVar15._4_4_ | auVar15._0_4_ | (uint)uVar13 >> 0x1f;
  bvh::v2::SmallStack<bvh::v2::Index<32UL,_4UL>,_64U>::push(&stack,&local_17c);
  local_198 = 0xffffffffffffffff;
  local_1b0 = accel;
LAB_00106815:
  do {
    if (stack.size == 0) {
      return local_198;
    }
    IVar12.value = (Type)bvh::v2::SmallStack<bvh::v2::Index<32UL,_4UL>,_64U>::pop(&stack);
    while( true ) {
      uVar13 = (ulong)(IVar12.value >> 4);
      if ((IVar12.value & 0xf) != 0) break;
      pNVar5 = (accel->bvh).nodes.
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(ray->org).values;
      local_1d8 = (undefined1  [8])&v;
      unique0x00004e80 = &local_208;
      pNVar1 = pNVar5 + uVar13;
      auVar16 = vinsertps_avx(ZEXT416(*(uint *)((long)&pNVar1->bounds + (ulong)(local_208 & 1) * 4))
                              ,ZEXT416(*(uint *)((long)&pNVar1->bounds +
                                                (ulong)(local_208 * 2 & 4) + 8)),0x10);
      local_1a8.values[2] =
           (*(float *)((long)&pNVar1->bounds + (ulong)(local_208 & 4) + 0x10) - (ray->org).values[2]
           ) * (float)local_158._0_4_;
      auVar16 = vsubps_avx(auVar16,auVar27);
      auVar28._0_4_ = auVar16._0_4_ * (float)local_148._0_4_;
      auVar28._4_4_ = auVar16._4_4_ * (float)local_148._4_4_;
      auVar28._8_4_ = auVar16._8_4_ * fStack_140;
      auVar28._12_4_ = auVar16._12_4_ * fStack_13c;
      local_1a8.values._0_8_ = vmovlps_avx(auVar28);
      local_200._0_8_ = pNVar1;
      local_1d0 = (Vec<float,_3UL> *)local_200;
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1d8,0);
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1d8,1);
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1d8,2);
      auVar21._4_4_ = v.values[1];
      auVar21._0_4_ = v.values[0];
      auVar21._8_8_ = 0;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(ray->org).values;
      local_1d0 = &local_1a8;
      auVar16 = vsubps_avx(auVar21,auVar32);
      auVar22._0_4_ = auVar16._0_4_ * local_168;
      auVar22._4_4_ = auVar16._4_4_ * fStack_164;
      auVar22._8_4_ = auVar16._8_4_ * fStack_160;
      auVar22._12_4_ = auVar16._12_4_ * fStack_15c;
      local_200._0_8_ = vmovlps_avx(auVar22);
      stack0xfffffffffffffe08 =
           (uint *)CONCAT44(auStack_1f4,
                            (v.values[2] - (ray->org).values[2]) * (float)local_178._0_4_);
      v.values[0] = ray->tmin;
      t1 = ray->tmax;
      local_1c8 = &t1;
      local_1d8 = (undefined1  [8])&v;
      local_1c0 = (Vec<float,_3UL> *)local_200;
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1d8,0);
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1d8,1);
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1d8,2);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)(ray->org).values;
      auVar16 = vinsertps_avx(ZEXT416(*(uint *)((long)(pNVar1 + 1) + (ulong)(local_208 & 1) * 4)),
                              ZEXT416(*(uint *)((long)(pNVar1 + 1) + 8U + (ulong)(local_208 * 2 & 4)
                                               )),0x10);
      local_1b8 = (pointer)CONCAT44(local_1b8._4_4_,v.values[0]);
      auVar16 = vsubps_avx(auVar16,auVar29);
      auVar30._0_4_ = auVar16._0_4_ * (float)local_148._0_4_;
      auVar30._4_4_ = auVar16._4_4_ * (float)local_148._4_4_;
      auVar30._8_4_ = auVar16._8_4_ * fStack_140;
      auVar30._12_4_ = auVar16._12_4_ * fStack_13c;
      local_204 = t1;
      local_1a8.values[2] =
           (*(float *)((long)(pNVar1 + 1) + 0x10U + (ulong)(local_208 & 4)) - (ray->org).values[2])
           * (float)local_158._0_4_;
      unique0x00004e80 = &local_208;
      local_1a8.values._0_8_ = vmovlps_avx(auVar30);
      local_200._0_8_ = pNVar5 + uVar13 + 1;
      local_1d8 = (undefined1  [8])&v;
      local_1d0 = (Vec<float,_3UL> *)local_200;
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1d8,0);
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1d8,1);
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1d8,2);
      auVar23._4_4_ = v.values[1];
      auVar23._0_4_ = v.values[0];
      auVar23._8_8_ = 0;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)(ray->org).values;
      local_1d0 = &local_1a8;
      auVar16 = vsubps_avx(auVar23,auVar33);
      auVar24._0_4_ = auVar16._0_4_ * local_168;
      auVar24._4_4_ = auVar16._4_4_ * fStack_164;
      auVar24._8_4_ = auVar16._8_4_ * fStack_160;
      auVar24._12_4_ = auVar16._12_4_ * fStack_15c;
      local_200._0_8_ = vmovlps_avx(auVar24);
      stack0xfffffffffffffe08 =
           (uint *)CONCAT44(auStack_1f4,
                            (v.values[2] - (ray->org).values[2]) * (float)local_178._0_4_);
      v.values[0] = ray->tmin;
      t1 = ray->tmax;
      local_1c8 = &t1;
      local_1d8 = (undefined1  [8])&v;
      local_1c0 = (Vec<float,_3UL> *)local_200;
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1d8,0);
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1d8,1);
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1d8,2);
      accel = local_1b0;
      if (local_1b8._0_4_ <= local_204) {
        IVar12.value = (pNVar1->index).value;
        if (v.values[0] <= t1) {
          IVar4.value = ((Index *)((long)(pNVar1 + 1) + 0x18))->value;
          IVar11.value = IVar12.value;
          if (v.values[0] < local_1b8._0_4_) {
            IVar11.value = IVar4.value;
            IVar4.value = IVar12.value;
          }
          IVar12.value = IVar11.value;
          local_1d8._0_4_ = IVar4.value;
          bvh::v2::SmallStack<bvh::v2::Index<32UL,_4UL>,_64U>::push
                    (&stack,(Index<32UL,_4UL> *)local_1d8);
        }
      }
      else {
        if (t1 < v.values[0]) goto LAB_00106815;
        IVar12.value = ((Index *)((long)(pNVar1 + 1) + 0x18))->value;
      }
    }
    for (; uVar13 < (IVar12.value & 0xf) + (IVar12.value >> 4); uVar13 = uVar13 + 1) {
      pPVar6 = (accel->tris).
               super__Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(ray->org).values;
      sVar7 = (accel->bvh).prim_ids.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13];
      pVVar2 = &pPVar6[sVar7].n;
      local_1b8 = pPVar6 + sVar7 + 1;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)(((PrecomputedTri<float> *)(pVVar2 + -3))->p0).values;
      auVar15 = vsubps_avx(auVar25,auVar31);
      fVar9 = (((PrecomputedTri<float> *)(pVVar2 + -3))->p0).values[2] - (ray->org).values[2];
      local_1d8 = (undefined1  [8])vmovlps_avx(auVar15);
      auVar16 = vmovshdup_avx(auVar15);
      local_1d0 = (Vec<float,_3UL> *)CONCAT44(local_1d0._4_4_,fVar9);
      fVar34 = (ray->dir).values[2];
      fVar18 = (ray->dir).values[0];
      fVar3 = (ray->dir).values[1];
      auVar17 = vfmsub231ss_fma(ZEXT416((uint)(auVar16._0_4_ * fVar34)),ZEXT416((uint)fVar3),
                                ZEXT416((uint)fVar9));
      auVar10 = vfmsub231ss_fma(ZEXT416((uint)(fVar9 * fVar18)),auVar15,ZEXT416((uint)fVar34));
      auVar15 = vfmsub231ss_fma(ZEXT416((uint)(auVar15._0_4_ * fVar3)),ZEXT416((uint)fVar18),auVar16
                               );
      auVar16 = vinsertps_avx(auVar17,auVar10,0x10);
      local_200._0_8_ = vmovlps_avx(auVar16);
      stack0xfffffffffffffe08 = (uint *)CONCAT44(auStack_1f4,auVar15._0_4_);
      local_188 = sVar7;
      fVar34 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,pVVar2,local_1b8,local_190);
      fVar34 = 1.0 / fVar34;
      local_204 = std::
                  transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                            (0,local_200,auStack_1f4,&pPVar6[sVar7].e2);
      local_204 = local_204 * fVar34;
      fVar18 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,local_200,auStack_1f4,&pPVar6[sVar7].e1);
      if (((-1.1920929e-07 <= local_204) && (-1.1920929e-07 <= fVar34 * fVar18)) &&
         (-1.1920929e-07 <= (1.0 - local_204) - fVar34 * fVar18)) {
        fVar18 = std::
                 transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                           (0,pVVar2,local_1b8,local_1d8);
        fVar18 = fVar18 * fVar34;
        if ((ray->tmin <= fVar18) && (fVar18 <= ray->tmax)) {
          ray->tmax = fVar18;
          local_198 = local_188;
        }
      }
      accel = local_1b0;
    }
  } while( true );
}

Assistant:

static size_t intersect_accel(Ray& ray, const Accel& accel, TraversalStats& stats) {
    size_t prim_id = invalid_id;
    bvh::v2::SmallStack<Bvh::Index, stack_size> stack;
    accel.bvh.intersect<false, UseRobustTraversal>(ray, accel.bvh.get_root().index, stack,
        [&] (size_t begin, size_t end) {
            if constexpr (CaptureStats)
                stats.visited_leaves++;
            for (size_t i = begin; i < end; ++i) {
                size_t j = PermutePrims ? i : accel.bvh.prim_ids[i];
                if (auto hit = accel.tris[j].intersect(ray)) {
                    ray.tmax = std::get<0>(*hit);
                    prim_id = j;
                }
            }
            return prim_id != invalid_id;
        },
        [&] (auto&&, auto&&) {
            if constexpr (CaptureStats)
                stats.visited_nodes++;
        });
    return prim_id;
}